

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Parse *pParse_00;
  Expr *pEVar5;
  undefined8 *in_RDI;
  Parse *pParse;
  CollSeq *pColl;
  int j;
  int k;
  WhereTerm *pTerm;
  WhereClause *pWC;
  Expr *pX;
  i16 iColumn;
  int iCur;
  Expr *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined8 *local_28;
  
  iVar4 = *(int *)(in_RDI + 5);
  local_28 = (undefined8 *)in_RDI[1];
  do {
    sVar1 = *(short *)((long)in_RDI + (long)(int)(*(byte *)((long)in_RDI + 0x22) - 1) * 2 + 0x58);
    iVar2 = *(int *)((long)in_RDI + (long)(int)(*(byte *)((long)in_RDI + 0x22) - 1) * 4 + 0x2c);
    do {
      pParse_00 = (Parse *)(local_28[4] + (long)iVar4 * 0x40);
      for (; iVar4 < *(int *)((long)local_28 + 0x14); iVar4 = iVar4 + 1) {
        iVar3._0_1_ = pParse_00->colNamesSet;
        iVar3._1_1_ = pParse_00->checkSchema;
        iVar3._2_1_ = pParse_00->nested;
        iVar3._3_1_ = pParse_00->nTempReg;
        if ((((iVar3 == iVar2) && (pParse_00->nRangeReg == (int)sVar1)) &&
            ((sVar1 != -2 ||
             (iVar3 = sqlite3ExprCompareSkip
                                ((Expr *)pParse_00,(Expr *)CONCAT44(iVar4,in_stack_ffffffffffffffc8)
                                 ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)), iVar3 == 0))))
           && ((*(byte *)((long)in_RDI + 0x22) < 2 ||
               (((ulong)pParse_00->db->pVfs & 0x100000000) == 0)))) {
          if ((((ulong)pParse_00->pVdbe & 0x80000000000) != 0) &&
             ((*(byte *)((long)in_RDI + 0x21) < 0xb &&
              (pEVar5 = sqlite3ExprSkipCollate((Expr *)pParse_00->db->mutex), pEVar5->op == 0x9e))))
          {
            in_stack_ffffffffffffffc8 = 0;
            while (((int)in_stack_ffffffffffffffc8 < (int)(uint)*(byte *)((long)in_RDI + 0x21) &&
                   ((*(int *)((long)in_RDI + (long)(int)in_stack_ffffffffffffffc8 * 4 + 0x2c) !=
                     pEVar5->iTable ||
                    (*(short *)((long)in_RDI + (long)(int)in_stack_ffffffffffffffc8 * 2 + 0x58) !=
                     pEVar5->iColumn))))) {
              in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1;
            }
            if (in_stack_ffffffffffffffc8 == *(byte *)((long)in_RDI + 0x21)) {
              *(int *)((long)in_RDI + (long)(int)in_stack_ffffffffffffffc8 * 4 + 0x2c) =
                   pEVar5->iTable;
              *(ynVar *)((long)in_RDI + (long)(int)in_stack_ffffffffffffffc8 * 2 + 0x58) =
                   pEVar5->iColumn;
              *(char *)((long)in_RDI + 0x21) = *(char *)((long)in_RDI + 0x21) + '\x01';
            }
          }
          if (((uint)*(u16 *)((long)&pParse_00->pVdbe + 4) & *(uint *)((long)in_RDI + 0x24)) != 0) {
            if ((in_RDI[2] == 0) || (((ulong)pParse_00->pVdbe & 0x10000000000) != 0)) {
LAB_001c3fe4:
              if ((((((ulong)pParse_00->pVdbe & 0x8200000000) == 0) ||
                   (pEVar5 = (Expr *)pParse_00->db->mutex, pEVar5->op != 0x9e)) ||
                  (pEVar5->iTable != *(int *)((long)in_RDI + 0x2c))) ||
                 (pEVar5->iColumn != *(short *)(in_RDI + 0xb))) {
                in_RDI[1] = local_28;
                *(int *)(in_RDI + 5) = iVar4 + 1;
                return (WhereTerm *)pParse_00;
              }
            }
            else {
              pEVar5 = *(Expr **)*local_28;
              iVar3 = sqlite3IndexAffinityOk(pEVar5,'\0');
              if (iVar3 != 0) {
                in_stack_ffffffffffffffc0 =
                     (Expr *)sqlite3BinaryCompareCollSeq
                                       (pParse_00,(Expr *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc0);
                if (in_stack_ffffffffffffffc0 == (Expr *)0x0) {
                  in_stack_ffffffffffffffc0 = *(Expr **)(*(long *)pEVar5 + 0x10);
                }
                iVar3 = sqlite3StrICmp(*(char **)in_stack_ffffffffffffffc0,(char *)in_RDI[2]);
                if (iVar3 == 0) goto LAB_001c3fe4;
              }
            }
          }
        }
        pParse_00 = (Parse *)&pParse_00->szOpAlloc;
      }
      local_28 = (undefined8 *)local_28[1];
      iVar4 = 0;
    } while (local_28 != (undefined8 *)0x0);
    if (*(byte *)((long)in_RDI + 0x21) <= *(byte *)((long)in_RDI + 0x22)) {
      return (WhereTerm *)0x0;
    }
    local_28 = (undefined8 *)*in_RDI;
    iVar4 = 0;
    *(char *)((long)in_RDI + 0x22) = *(char *)((long)in_RDI + 0x22) + '\x01';
  } while( true );
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        if( pTerm->leftCursor==iCur
         && pTerm->u.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_FromJoin))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight))->op==TK_COLUMN
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,
                                                  pX->pLeft, pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight)->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}